

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::DirtyStackingContext(Element *this)

{
  byte local_19;
  Element *local_18;
  Element *stacking_context_parent;
  Element *this_local;
  
  local_18 = this;
  while( true ) {
    local_19 = 0;
    if (local_18 != (Element *)0x0) {
      local_19 = local_18->local_stacking_context ^ 0xff;
    }
    if ((local_19 & 1) == 0) break;
    local_18 = GetParentNode(local_18);
  }
  if (local_18 != (Element *)0x0) {
    local_18->stacking_context_dirty = true;
  }
  return;
}

Assistant:

void Element::DirtyStackingContext()
{
	// Find the first ancestor that has a local stacking context, that is our stacking context parent.
	Element* stacking_context_parent = this;
	while (stacking_context_parent && !stacking_context_parent->local_stacking_context)
	{
		stacking_context_parent = stacking_context_parent->GetParentNode();
	}

	if (stacking_context_parent)
		stacking_context_parent->stacking_context_dirty = true;
}